

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

bool do_mob_cast(CHAR_DATA *ch)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  CHAR_DATA *pCVar5;
  char *pcVar6;
  CHAR_DATA *pCVar7;
  
  bVar1 = is_npc(ch);
  if (((bVar1) && (ch->fighting != (CHAR_DATA *)0x0)) &&
     (ch->pIndexData->cast_spell[0] != (char *)0x0)) {
    do {
      iVar4 = number_range(0,9);
      pcVar6 = ch->pIndexData->cast_spell[(short)iVar4];
    } while (pcVar6 == (char *)0x0);
    iVar4 = skill_lookup(pcVar6);
    sVar2 = (short)iVar4;
    if (0 < sVar2) {
      sVar3 = skill_table[sVar2].target;
      if (sVar3 == 1) {
        pCVar5 = ch->in_room->people;
        if (pCVar5 == (CHAR_DATA *)0x0) {
          iVar4 = 0;
        }
        else {
          sVar3 = 0;
          do {
            bVar1 = is_npc(pCVar5);
            if (!bVar1) {
              sVar3 = sVar3 + (ushort)(pCVar5->fighting == ch &&
                                      pCVar5->fighting != (CHAR_DATA *)0x0);
            }
            pCVar5 = pCVar5->next_in_room;
          } while (pCVar5 != (CHAR_DATA *)0x0);
          iVar4 = (int)sVar3;
        }
        iVar4 = number_range(1,iVar4);
        pCVar5 = ch->in_room->people;
        if (pCVar5 != (CHAR_DATA *)0x0) {
          sVar3 = 0;
          do {
            bVar1 = is_npc(pCVar5);
            if (!bVar1) {
              sVar3 = sVar3 + (ushort)(pCVar5->fighting == ch);
            }
            if ((short)iVar4 == sVar3) goto LAB_002c0c58;
            pCVar5 = pCVar5->next_in_room;
          } while (pCVar5 != (CHAR_DATA *)0x0);
        }
        pCVar5 = ch->fighting;
LAB_002c0c58:
        sVar3 = skill_table[sVar2].target;
      }
      else {
        pCVar5 = ch->fighting;
      }
      pCVar7 = pCVar5;
      if (sVar3 == 2) {
        pCVar7 = ch;
      }
      if ((ch->act[0] & 0x10000) == 0) {
        if ((ch->form[0] & 0x20000000) == 0) {
          say_spell(ch,(int)sVar2);
        }
      }
      else {
        if (sVar3 == 2) {
          pcVar6 = "$n closes $s eyes with a look of concentration for a moment.";
          pCVar5 = (CHAR_DATA *)0x0;
          iVar4 = 0;
        }
        else {
          act("You narrow your eyes and glare in $N\'s direction.",ch,(void *)0x0,pCVar5,3);
          act("$n narrows $s eyes and glares in $N\'s direction.",ch,(void *)0x0,pCVar5,1);
          pcVar6 = "$n narrows $s eyes and glares in your direction.";
          iVar4 = 2;
        }
        act(pcVar6,ch,(void *)0x0,pCVar5,iVar4);
      }
      (*skill_table[sVar2].spell_fun)((int)sVar2,(int)ch->level,ch,pCVar7,1);
      return true;
    }
  }
  return false;
}

Assistant:

bool do_mob_cast(CHAR_DATA *ch)
{
	short i, sn, rnd, in_room = 0, room_occupant = 0;
	CHAR_DATA *vch, *victim;

	if (!is_npc(ch) || !ch->fighting || ch->pIndexData->cast_spell[0] == nullptr)
		return false;

	for (;;)
	{
		i = number_range(0, 9);
		if (ch->pIndexData->cast_spell[i] != nullptr)
			break;
	}

	sn = skill_lookup(ch->pIndexData->cast_spell[i]);

	if (sn < 1)
		return false;

	victim = ch->fighting;
	// Share the wealth.
	//
	if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
	{
		for (victim = ch->in_room->people; victim != nullptr; victim = victim->next_in_room)
		{
			if (victim && !is_npc(victim) && victim->fighting && victim->fighting == ch)
				in_room++;
		}

		rnd = number_range(1, in_room);

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			if (!is_npc(vch) && vch->fighting == ch)
				room_occupant++;

			if (rnd == room_occupant)
				break;
		}

		victim = vch != nullptr ? vch : ch->fighting;
	}

	if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		victim = ch;

	if (IS_SET(ch->act, ACT_CLERIC))
	{
		if (skill_table[sn].target == TAR_CHAR_DEFENSIVE)
		{
			act("$n closes $s eyes with a look of concentration for a moment.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("You narrow your eyes and glare in $N's direction.", ch, 0, victim, TO_CHAR);
			act("$n narrows $s eyes and glares in $N's direction.", ch, 0, victim, TO_NOTVICT);
			act("$n narrows $s eyes and glares in your direction.", ch, 0, victim, TO_VICT);
		}
	}
	else if (!IS_SET(ch->form, FORM_NOSPEECH))
	{
		say_spell(ch, sn);
	}

	(*skill_table[sn].spell_fun)(sn, ch->level, ch, victim, TAR_CHAR_OFFENSIVE);

	return true;
}